

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.c
# Opt level: O1

int enet_socket_connect(ENetSocket socket,ENetAddress *address)

{
  int iVar1;
  int *piVar2;
  sockaddr_in sin;
  sockaddr local_18;
  
  local_18.sa_data[6] = '\0';
  local_18.sa_data[7] = '\0';
  local_18.sa_data[8] = '\0';
  local_18.sa_data[9] = '\0';
  local_18.sa_data[10] = '\0';
  local_18.sa_data[0xb] = '\0';
  local_18.sa_data[0xc] = '\0';
  local_18.sa_data[0xd] = '\0';
  local_18.sa_data._0_2_ = address->port << 8 | address->port >> 8;
  local_18.sa_family = 2;
  local_18.sa_data._2_4_ = address->host;
  iVar1 = connect(socket,&local_18,0x10);
  if ((iVar1 == -1) && (piVar2 = __errno_location(), *piVar2 == 0x73)) {
    return 0;
  }
  return iVar1;
}

Assistant:

int
enet_socket_connect (ENetSocket socket, const ENetAddress * address)
{
    struct sockaddr_in sin;
    int result;

    memset (& sin, 0, sizeof (struct sockaddr_in));

    sin.sin_family = AF_INET;
    sin.sin_port = ENET_HOST_TO_NET_16 (address -> port);
    sin.sin_addr.s_addr = address -> host;

    result = connect (socket, (struct sockaddr *) & sin, sizeof (struct sockaddr_in));
    if (result == -1 && errno == EINPROGRESS)
      return 0;

    return result;
}